

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.h
# Opt level: O0

void __thiscall
state_machine::state_machine::StateMachine<$18d5a8f2$>::~StateMachine
          (StateMachine<_18d5a8f2_> *this)

{
  StateMachine<_18d5a8f2_> *this_local;
  
  variant::
  Variant<(anonymous_namespace)::Empty,(anonymous_namespace)::Stopped,(anonymous_namespace)::Open,(anonymous_namespace)::Playing,(anonymous_namespace)::Paused>
  ::
  visit<state_machine::state_machine::StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::Empty>,state_machine::transition::Event<(anonymous_namespace)::open_close>,state_machine::transition::detail::guard_always,(anonymous_namespace)::__0,state_machine::transition::State<(anonymous_namespace)::Open>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::Empty>,state_machine::transition::Event<(anonymous_namespace)::cd_detected>,(anonymous_namespace)::table()::__0,(anonymous_namespace)::table()::__1,state_machine::transition::State<(anonymous_namespace)::Stopped>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::Stopped>,state_machine::transition::Event<(anonymous_namespace)::play>,state_machine::transition::detail::guard_al____machine::transition::State<(anonymous_namespace)::Open>>>>>::~StateMachine()::_lambda(auto:1&&)_1_>
            ((Variant<(anonymous_namespace)::Empty,(anonymous_namespace)::Stopped,(anonymous_namespace)::Open,(anonymous_namespace)::Playing,(anonymous_namespace)::Paused>
              *)&this->state_);
  variant::
  Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
  ::~Variant(&this->state_);
  return;
}

Assistant:

~StateMachine() {
        state_.visit([](auto&& s) { detail::on_exit(std::forward<decltype(s)>(s)); });
    }